

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderView::mouseDoubleClickEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  QHeaderViewPrivate *this_00;
  Representation position;
  int iVar2;
  ResizeMode RVar3;
  long in_FS_OFFSET;
  QPoint local_50;
  QPointF local_48;
  long local_38;
  QPoint QVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
  if (OVar1 == Horizontal) {
    QVar4 = QPointF::toPoint(&local_48);
    position = QVar4.xp.m_i;
  }
  else {
    QVar4 = QPointF::toPoint(&local_48);
    position = QVar4.yp.m_i;
  }
  iVar2 = QHeaderViewPrivate::sectionHandleAt(this_00,position.m_i);
  if (-1 < iVar2) {
    RVar3 = sectionResizeMode(this,iVar2);
    if (RVar3 == Interactive) {
      sectionHandleDoubleClicked(this,iVar2);
      OVar1 = this_00->orientation;
      QWidget::cursor((QWidget *)&local_48);
      iVar2 = QCursor::shape();
      QCursor::~QCursor((QCursor *)&local_48);
      if (iVar2 == (OVar1 == Horizontal) + 0xb) {
        iVar2 = QHeaderViewPrivate::sectionHandleAt(this_00,position.m_i);
        if (-1 < iVar2) {
          RVar3 = sectionResizeMode(this,iVar2);
          if (RVar3 == Interactive) goto LAB_004fb927;
        }
        QCursor::QCursor((QCursor *)&local_48,ArrowCursor);
        QWidget::setCursor((QWidget *)this,(QCursor *)&local_48);
        QCursor::~QCursor((QCursor *)&local_48);
      }
      goto LAB_004fb927;
    }
  }
  local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
  local_50 = QPointF::toPoint(&local_48);
  iVar2 = logicalIndexAt(this,&local_50);
  sectionDoubleClicked(this,iVar2);
LAB_004fb927:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::mouseDoubleClickEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    int handle = d->sectionHandleAt(pos);
    if (handle > -1 && sectionResizeMode(handle) == Interactive) {
        emit sectionHandleDoubleClicked(handle);
#ifndef QT_NO_CURSOR
        Qt::CursorShape splitCursor = (d->orientation == Qt::Horizontal)
                                      ? Qt::SplitHCursor : Qt::SplitVCursor;
        if (cursor().shape() == splitCursor) {
            // signal handlers may have changed the section size
            handle = d->sectionHandleAt(pos);
            if (!(handle > -1 && sectionResizeMode(handle) == Interactive))
                setCursor(Qt::ArrowCursor);
        }
#endif
    } else {
        emit sectionDoubleClicked(logicalIndexAt(e->position().toPoint()));
    }
}